

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O2

void __thiscall
JobManagerTestSuite_StartCancel_Test::TestBody(JobManagerTestSuite_StartCancel_Test *this)

{
  element_type *this_00;
  element_type *peVar1;
  int iVar2;
  CommissionerAppMock *pCVar3;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar4;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar5;
  TypedExpectation<void_()> *pTVar6;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  long lVar7;
  char *expected_predicate_value;
  char *pcVar8;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<unsigned_long> __l_01;
  Status local_906;
  allocator local_905;
  allocator local_904;
  allocator local_903;
  allocator local_902;
  allocator local_901;
  allocator local_900;
  allocator local_8ff;
  allocator local_8fe;
  Status local_8fd;
  NetworkId nid;
  AssertionResult gtest_ar;
  BorderRouterId rid;
  BorderRouterId local_8cc;
  AssertionResult gtest_ar_2;
  _Any_data local_8b8;
  code *local_8a8;
  code *local_8a0;
  CommissionerAppMockPtr commissionerAppMocks [3];
  _Any_data local_868;
  _Base_ptr local_858;
  _Base_ptr p_Stack_850;
  AssertionResult gtest_ar_12;
  MatcherBase<const_ot::commissioner::Config_&> local_828;
  undefined1 local_808 [32];
  bool wasThreadRunning;
  undefined8 uStack_7e0;
  code *local_7d8;
  code *pcStack_7d0;
  bool shouldStop;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  string local_7a8;
  State local_784;
  State local_780;
  State local_77c;
  AssertionResult gtest_ar_1;
  undefined1 local_768 [8];
  undefined1 local_760 [376];
  AssertionResult gtest_ar_;
  UnixTime local_460;
  UnixTime local_458;
  UnixTime local_450;
  undefined1 local_448 [8];
  _Alloc_hider local_440;
  pointer local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  undefined1 local_420 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  TestContext ctx;
  
  JobManagerTestSuite::TestContext::TestContext(&ctx);
  JobManagerTestSuite::SetInitialExpectations(&this->super_JobManagerTestSuite,&ctx);
  gtest_ar_1._0_2_ = 0x3031;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ctx.mConf.mPSKc);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&nid);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&rid);
  peVar1 = ctx.mPS.
           super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_8b8,0);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_868,0);
  std::__cxx11::string::string((string *)&gtest_ar_,"pan1",(allocator *)&wasThreadRunning);
  pcVar8 = "";
  std::__cxx11::string::string((string *)commissionerAppMocks,"",(allocator *)&shouldStop);
  ot::commissioner::persistent_storage::Network::Network
            ((Network *)&gtest_ar_1,(NetworkId *)&local_8b8,(DomainId *)&local_868,
             (string *)&gtest_ar_,1,1,1,(string *)commissionerAppMocks,0);
  iVar2 = (*(peVar1->super_PersistentStorage)._vptr_PersistentStorage[6])(peVar1,&gtest_ar_1,&nid);
  gtest_ar_12.success_ = SUB41(iVar2,0);
  local_7a8._M_dataplus._M_p._0_1_ = 0;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&gtest_ar,"ctx.mPS->Add(Network{0, 0, \"pan1\", 1, 1, 0x1, \"\", 0}, nid)",
             "PersistentStorage::Status::kSuccess",&gtest_ar_12.success_,(Status *)&local_7a8);
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)commissionerAppMocks);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar8 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
               ,0xfc,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
    this_01 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar_1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar_1,"nid.mId","0",&nid.mId,(int *)&gtest_ar_);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0xfd,pcVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)commissionerAppMocks,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    peVar1 = ctx.mPS.
             super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_8cc,0);
    std::__cxx11::string::string((string *)commissionerAppMocks,"127.0.0.1",&local_8fe);
    local_828._vptr_MatcherBase = (_func_int **)0x0;
    local_828.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_828.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string((string *)&gtest_ar,"1.1",&local_8ff);
    ot::commissioner::BorderAgent::State::State(&local_77c,0,0,0,0,0);
    std::__cxx11::string::string((string *)local_8b8._M_pod_data,"",&local_900);
    std::__cxx11::string::string((string *)local_868._M_pod_data,"",&local_901);
    std::__cxx11::string::string((string *)&gtest_ar_12,"",&local_902);
    std::__cxx11::string::string((string *)&wasThreadRunning,"",&local_903);
    local_808._0_8_ = (element_type *)0x0;
    local_808._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_808._16_8_ = (pointer)0x0;
    std::__cxx11::string::string((string *)&shouldStop,"",&local_904);
    pcVar8 = "";
    std::__cxx11::string::string((string *)&local_7a8,"",&local_905);
    ot::commissioner::UnixTime::UnixTime(&local_450,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&gtest_ar_,(string *)commissionerAppMocks,0x4e21,
               (ByteArray *)&local_828,(string *)&gtest_ar,local_77c,(string *)&local_8b8,0,
               (string *)&local_868,(string *)&gtest_ar_12,(Timestamp)0x0,0,
               (string *)&wasThreadRunning,(ByteArray *)local_808,(string *)&shouldStop,'\0',0,
               &local_7a8,local_450,0xf);
    ot::commissioner::persistent_storage::BorderRouter::BorderRouter
              ((BorderRouter *)&gtest_ar_1,&local_8cc,&nid,(BorderAgent *)&gtest_ar_);
    iVar2 = (*(peVar1->super_PersistentStorage)._vptr_PersistentStorage[7])(peVar1,&gtest_ar_1,&rid)
    ;
    local_8fd = (Status)iVar2;
    local_906 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
              ((internal *)&gtest_ar_2,
               "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
               ,"PersistentStorage::Status::kSuccess",&local_8fd,&local_906);
    ot::commissioner::persistent_storage::BorderRouter::~BorderRouter((BorderRouter *)&gtest_ar_1);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)&shouldStop);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_808);
    std::__cxx11::string::~string((string *)&wasThreadRunning);
    std::__cxx11::string::~string((string *)&gtest_ar_12);
    std::__cxx11::string::~string((string *)local_868._M_pod_data);
    std::__cxx11::string::~string((string *)local_8b8._M_pod_data);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_828);
    std::__cxx11::string::~string((string *)commissionerAppMocks);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar8 = *(char **)gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x104,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
      this_01 = &gtest_ar_2.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if (gtest_ar_1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_2.message_);
      gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)&gtest_ar_1,"rid.mId","0",&rid.mId,(int *)&gtest_ar_);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x105,pcVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)commissionerAppMocks,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      peVar1 = ctx.mPS.
               super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_8b8,0);
      ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_868,0);
      std::__cxx11::string::string((string *)&gtest_ar_,"pan2",(allocator *)&wasThreadRunning);
      pcVar8 = "";
      std::__cxx11::string::string((string *)commissionerAppMocks,"",(allocator *)&shouldStop);
      ot::commissioner::persistent_storage::Network::Network
                ((Network *)&gtest_ar_1,(NetworkId *)&local_8b8,(DomainId *)&local_868,
                 (string *)&gtest_ar_,2,2,2,(string *)commissionerAppMocks,0);
      iVar2 = (*(peVar1->super_PersistentStorage)._vptr_PersistentStorage[6])
                        (peVar1,&gtest_ar_1,&nid);
      gtest_ar_12.success_ = SUB41(iVar2,0);
      local_7a8._M_dataplus._M_p._0_1_ = 0;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                ((internal *)&gtest_ar,
                 "ctx.mPS->Add(Network{0, 0, \"pan2\", 2, 2, 0x2, \"\", 0}, nid)",
                 "PersistentStorage::Status::kSuccess",&gtest_ar_12.success_,(Status *)&local_7a8);
      ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar_1);
      std::__cxx11::string::~string((string *)commissionerAppMocks);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar8 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x107,pcVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
        this_01 = &gtest_ar.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        if (gtest_ar_1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        gtest_ar_._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&gtest_ar_1,"nid.mId","1",&nid.mId,(int *)&gtest_ar_);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x108,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)commissionerAppMocks,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        peVar1 = ctx.mPS.
                 super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_8cc,0);
        std::__cxx11::string::string((string *)commissionerAppMocks,"127.0.0.1",&local_8fe);
        local_828._vptr_MatcherBase = (_func_int **)0x0;
        local_828.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_828.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__cxx11::string::string((string *)&gtest_ar,"1.1",&local_8ff);
        ot::commissioner::BorderAgent::State::State(&local_780,0,0,0,0,0);
        std::__cxx11::string::string((string *)local_8b8._M_pod_data,"",&local_900);
        std::__cxx11::string::string((string *)local_868._M_pod_data,"",&local_901);
        std::__cxx11::string::string((string *)&gtest_ar_12,"",&local_902);
        std::__cxx11::string::string((string *)&wasThreadRunning,"",&local_903);
        local_808._0_8_ = (element_type *)0x0;
        local_808._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_808._16_8_ = (pointer)0x0;
        std::__cxx11::string::string((string *)&shouldStop,"",&local_904);
        pcVar8 = "";
        std::__cxx11::string::string((string *)&local_7a8,"",&local_905);
        ot::commissioner::UnixTime::UnixTime(&local_458,0);
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&gtest_ar_,(string *)commissionerAppMocks,0x4e22,
                   (ByteArray *)&local_828,(string *)&gtest_ar,local_780,(string *)&local_8b8,0,
                   (string *)&local_868,(string *)&gtest_ar_12,(Timestamp)0x0,0,
                   (string *)&wasThreadRunning,(ByteArray *)local_808,(string *)&shouldStop,'\0',0,
                   &local_7a8,local_458,0xf);
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                  ((BorderRouter *)&gtest_ar_1,&local_8cc,&nid,(BorderAgent *)&gtest_ar_);
        iVar2 = (*(peVar1->super_PersistentStorage)._vptr_PersistentStorage[7])
                          (peVar1,&gtest_ar_1,&rid);
        local_8fd = (Status)iVar2;
        local_906 = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                  ((internal *)&gtest_ar_2,
                   "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                   ,"PersistentStorage::Status::kSuccess",&local_8fd,&local_906);
        ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
                  ((BorderRouter *)&gtest_ar_1);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
        std::__cxx11::string::~string((string *)&local_7a8);
        std::__cxx11::string::~string((string *)&shouldStop);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_808);
        std::__cxx11::string::~string((string *)&wasThreadRunning);
        std::__cxx11::string::~string((string *)&gtest_ar_12);
        std::__cxx11::string::~string((string *)local_868._M_pod_data);
        std::__cxx11::string::~string((string *)local_8b8._M_pod_data);
        std::__cxx11::string::~string((string *)&gtest_ar);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_828);
        std::__cxx11::string::~string((string *)commissionerAppMocks);
        if (gtest_ar_2.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_1);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar_2.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x10f,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
          this_01 = &gtest_ar_2.message_;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          if (gtest_ar_1._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
          }
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_2.message_);
          gtest_ar_._0_4_ = 1;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&gtest_ar_1,"rid.mId","1",&rid.mId,(int *)&gtest_ar_);
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x110,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)commissionerAppMocks,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_1.message_);
          peVar1 = ctx.mPS.
                   super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_8b8,0);
          ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_868,0);
          std::__cxx11::string::string((string *)&gtest_ar_,"pan3",(allocator *)&wasThreadRunning);
          pcVar8 = "";
          std::__cxx11::string::string((string *)commissionerAppMocks,"",(allocator *)&shouldStop);
          ot::commissioner::persistent_storage::Network::Network
                    ((Network *)&gtest_ar_1,(NetworkId *)&local_8b8,(DomainId *)&local_868,
                     (string *)&gtest_ar_,3,3,3,(string *)commissionerAppMocks,0);
          iVar2 = (*(peVar1->super_PersistentStorage)._vptr_PersistentStorage[6])
                            (peVar1,&gtest_ar_1,&nid);
          gtest_ar_12.success_ = SUB41(iVar2,0);
          local_7a8._M_dataplus._M_p._0_1_ = 0;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                    ((internal *)&gtest_ar,
                     "ctx.mPS->Add(Network{0, 0, \"pan3\", 3, 3, 0x3, \"\", 0}, nid)",
                     "PersistentStorage::Status::kSuccess",&gtest_ar_12.success_,
                     (Status *)&local_7a8);
          ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar_1);
          std::__cxx11::string::~string((string *)commissionerAppMocks);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_1);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar8 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x112,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
            this_01 = &gtest_ar.message_;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if (gtest_ar_1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
            }
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            gtest_ar_._0_4_ = 2;
            testing::internal::CmpHelperEQ<unsigned_int,int>
                      ((internal *)&gtest_ar_1,"nid.mId","2",&nid.mId,(int *)&gtest_ar_);
            if (gtest_ar_1.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)gtest_ar_1.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x113,pcVar8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)commissionerAppMocks,(Message *)&gtest_ar_);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks);
              if (gtest_ar_._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_1.message_);
            ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_8cc,0);
            std::__cxx11::string::string((string *)commissionerAppMocks,"127.0.0.1",&local_8fe);
            local_828._vptr_MatcherBase = (_func_int **)0x0;
            local_828.impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_828.impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::__cxx11::string::string((string *)&gtest_ar,"1.1",&local_8ff);
            ot::commissioner::BorderAgent::State::State(&local_784,0,0,0,0,0);
            std::__cxx11::string::string((string *)local_8b8._M_pod_data,"",&local_900);
            std::__cxx11::string::string((string *)local_868._M_pod_data,"",&local_901);
            std::__cxx11::string::string((string *)&gtest_ar_12,"",&local_902);
            std::__cxx11::string::string((string *)&wasThreadRunning,"",&local_903);
            local_808._0_8_ = (element_type *)0x0;
            local_808._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_808._16_8_ = (pointer)0x0;
            std::__cxx11::string::string((string *)&shouldStop,"",&local_904);
            pcVar8 = "";
            std::__cxx11::string::string((string *)&local_7a8,"",&local_905);
            ot::commissioner::UnixTime::UnixTime(&local_460,0);
            expected_predicate_value = (char *)(ulong)(uint)local_784;
            ot::commissioner::BorderAgent::BorderAgent
                      ((BorderAgent *)&gtest_ar_,(string *)commissionerAppMocks,0x4e23,
                       (ByteArray *)&local_828,(string *)&gtest_ar,local_784,(string *)&local_8b8,0,
                       (string *)&local_868,(string *)&gtest_ar_12,(Timestamp)0x0,0,
                       (string *)&wasThreadRunning,(ByteArray *)local_808,(string *)&shouldStop,'\0'
                       ,0,&local_7a8,local_460,0xf);
            ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                      ((BorderRouter *)&gtest_ar_1,&local_8cc,&nid,(BorderAgent *)&gtest_ar_);
            iVar2 = (*((ctx.mPS.
                        super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_PersistentStorage)._vptr_PersistentStorage[7])
                              (ctx.mPS.
                               super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&gtest_ar_1,&rid);
            local_8fd = (Status)iVar2;
            local_906 = kSuccess;
            testing::internal::
            CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                      ((internal *)&gtest_ar_2,
                       "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                       ,"PersistentStorage::Status::kSuccess",&local_8fd,&local_906);
            ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
                      ((BorderRouter *)&gtest_ar_1);
            ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
            std::__cxx11::string::~string((string *)&local_7a8);
            std::__cxx11::string::~string((string *)&shouldStop);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_808);
            std::__cxx11::string::~string((string *)&wasThreadRunning);
            std::__cxx11::string::~string((string *)&gtest_ar_12);
            std::__cxx11::string::~string((string *)local_868._M_pod_data);
            std::__cxx11::string::~string((string *)local_8b8._M_pod_data);
            std::__cxx11::string::~string((string *)&gtest_ar);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_828);
            std::__cxx11::string::~string((string *)commissionerAppMocks);
            if (gtest_ar_2.success_ != false) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_2.message_);
              gtest_ar_._0_4_ = 2;
              testing::internal::CmpHelperEQ<unsigned_int,int>
                        ((internal *)&gtest_ar_1,"rid.mId","2",&rid.mId,(int *)&gtest_ar_);
              if (gtest_ar_1.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar8 = "";
                }
                else {
                  pcVar8 = *(char **)gtest_ar_1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)commissionerAppMocks,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x11b,pcVar8);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)commissionerAppMocks,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)commissionerAppMocks)
                ;
                if (gtest_ar_._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_1.message_);
              std::__cxx11::string::string((string *)&gtest_ar_1,".",(allocator *)&gtest_ar_);
              JobManagerTestSuite::Init(&this->super_JobManagerTestSuite,&ctx,(string *)&gtest_ar_1)
              ;
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              gtest_ar_2.success_ = false;
              pCVar3 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar3,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar3);
              std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<CommissionerAppMock,void>
                        ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                         commissionerAppMocks,pCVar3);
              pCVar3 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar3,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar3);
              std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<CommissionerAppMock,void>
                        ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                         (commissionerAppMocks + 1),pCVar3);
              pCVar3 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar3,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar3);
              std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<CommissionerAppMock,void>
                        ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                         (commissionerAppMocks + 2),pCVar3);
              testing::A<std::shared_ptr<ot::commissioner::CommissionerApp>&>();
              testing::A<ot::commissioner::Config_const&>();
              CommissionerAppStaticExpecter::gmock_Create
                        ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)&gtest_ar_,&ctx.mCommissionerAppStaticExpecter,
                         (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_7a8
                         ,(Matcher<const_ot::commissioner::Config_&> *)&local_828);
              testing::internal::GetWithoutMatchers();
              pTVar4 = testing::internal::
                       MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::InternalExpectedAt
                                 ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                   *)&gtest_ar_,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x124,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
              pTVar4 = testing::internal::
                       TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::Times(pTVar4,3);
              local_420._0_4_ = kNone;
              local_418._M_allocated_capacity = (size_type)&local_408;
              local_418._8_8_ = 0;
              local_408._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)local_808,(Error *)local_420);
              std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &shouldStop,
                         (__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         local_808);
              gtest_ar.success_ = false;
              gtest_ar._1_7_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              local_8a8 = std::
                          _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:295:30)>
                          ::_M_manager;
              local_8a0 = std::
                          _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:295:30)>
                          ::_M_invoke;
              local_8b8._M_unused._0_8_ =
                   (undefined8)
                   (__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                   commissionerAppMocks;
              local_8b8._8_8_ = &gtest_ar_2;
              local_7b8._M_allocated_capacity =
                   (size_type)
                   (__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                   commissionerAppMocks;
              local_7b8._8_8_ = &gtest_ar_2;
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
              std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                        ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                         &local_868,
                         (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                         &local_8b8);
              gtest_ar_12.success_ = false;
              gtest_ar_12._1_7_ = 0;
              gtest_ar_12.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar.success_ = false;
              gtest_ar._1_7_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_12._0_8_ = operator_new(0x20);
              *(undefined8 *)gtest_ar_12._0_8_ = 0;
              *(undefined8 *)(gtest_ar_12._0_8_ + 8) = 0;
              *(undefined8 *)(gtest_ar_12._0_8_ + 0x10) = 0;
              *(_Base_ptr *)(gtest_ar_12._0_8_ + 0x18) = p_Stack_850;
              if (local_858 != (_Base_ptr)0x0) {
                *(void **)gtest_ar_12._0_8_ = local_868._M_unused._M_object;
                *(undefined8 *)(gtest_ar_12._0_8_ + 8) = local_868._8_8_;
                *(_Base_ptr *)(gtest_ar_12._0_8_ + 0x10) = local_858;
                local_858 = (_Base_ptr)0x0;
                p_Stack_850 = (_Base_ptr)0x0;
              }
              gtest_ar_12.message_ = gtest_ar.message_;
              gtest_ar.success_ = false;
              gtest_ar._1_7_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
              std::_Function_base::~_Function_base((_Function_base *)&local_868);
              std::_Function_base::~_Function_base((_Function_base *)&local_8b8);
              __l._M_len = 1;
              __l._M_array = (iterator)&gtest_ar_12;
              std::
              vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
              ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                        *)&gtest_ar_1,__l,(allocator_type *)&gtest_ar);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_12);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)local_760,(ReturnAction *)&shouldStop);
              local_7d8 = (code *)0x0;
              pcStack_7d0 = (code *)0x0;
              _wasThreadRunning = (pointer)0x0;
              uStack_7e0 = 0;
              gtest_ar.success_ = false;
              gtest_ar._1_7_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              _wasThreadRunning = operator_new(0x38);
              *(undefined8 *)_wasThreadRunning = gtest_ar_1._0_8_;
              ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)(_wasThreadRunning + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              *(undefined1 (*) [8])(_wasThreadRunning + 0x10) = local_768;
              gtest_ar_1.success_ = false;
              gtest_ar_1._1_7_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              *(undefined8 *)(_wasThreadRunning + 0x18) = 0;
              *(undefined8 *)(_wasThreadRunning + 0x20) = 0;
              *(undefined8 *)(_wasThreadRunning + 0x28) = 0;
              *(undefined8 *)(_wasThreadRunning + 0x30) = local_760._24_8_;
              if (local_760._16_8_ != 0) {
                *(undefined8 *)(_wasThreadRunning + 0x18) = local_760._0_8_;
                *(undefined8 *)(_wasThreadRunning + 0x20) = local_760._8_8_;
                *(undefined8 *)(_wasThreadRunning + 0x28) = local_760._16_8_;
                local_760._16_8_ = 0;
                local_760._24_4_ = 0;
                local_760._28_2_ = 0;
                local_760._30_2_ = 0;
              }
              uStack_7e0 = gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
              gtest_ar.success_ = false;
              gtest_ar._1_7_ = 0;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              local_7d8 = std::_Function_handler::operator_cast_to_Action;
              pcStack_7d0 = std::_Function_handler::operator_cast_to_Action;
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
              anon_func::Op::~Op((Op *)&gtest_ar_1);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::WillRepeatedly(pTVar4,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                       *)&wasThreadRunning);
              std::_Function_base::~_Function_base((_Function_base *)&wasThreadRunning);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7c0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_808 + 8));
              std::__cxx11::string::~string((string *)(local_420 + 8));
              std::
              _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
              ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                              *)&gtest_ar_.message_);
              testing::internal::MatcherBase<const_ot::commissioner::Config_&>::~MatcherBase
                        (&local_828);
              testing::internal::MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::
              ~MatcherBase((MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                           &local_7a8);
              std::__cxx11::string::string((string *)&gtest_ar_,"start",(allocator *)&shouldStop);
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)&gtest_ar_;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&gtest_ar,__l_00,(allocator_type *)&local_7a8);
              local_868._M_unused._M_member_pointer = 1;
              local_868._8_8_ = 2;
              local_858 = (_Base_ptr)0x3;
              __l_01._M_len = 3;
              __l_01._M_array = (iterator)&local_868;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_8b8,__l_01,
                         (allocator_type *)&local_828);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&gtest_ar_1,&ctx.mJobManager,(Expression *)&gtest_ar,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_8b8,false);
              _wasThreadRunning = _wasThreadRunning & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)&gtest_ar_12,
                         "ctx.mJobManager.PrepareJobs({\"start\"}, {0x1, 0x2, 0x3}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)&gtest_ar_1,(ErrorCode *)&wasThreadRunning)
              ;
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_8b8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
              std::__cxx11::string::~string((string *)&gtest_ar_);
              if (gtest_ar_12.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_1);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_12.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar8 = "";
                }
                else {
                  pcVar8 = *(char **)gtest_ar_12.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x12a,pcVar8);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
                if (gtest_ar_1._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_12.message_);
              gtest_ar_._0_4_ = 3;
              testing::internal::CmpHelperEQ<unsigned_char,int>
                        ((internal *)&gtest_ar_1,"camIdx","3",&gtest_ar_2.success_,(int *)&gtest_ar_
                        );
              if (gtest_ar_1.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar8 = "";
                }
                else {
                  pcVar8 = *(char **)gtest_ar_1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,299,pcVar8);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
                if (gtest_ar_._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_1.message_);
              for (gtest_ar_2.success_ = false;
                  this_00 = commissionerAppMocks[2].
                            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr, gtest_ar_2.success_ < 2;
                  gtest_ar_2.success_ = (bool)(gtest_ar_2.success_ + 1)) {
                pCVar3 = commissionerAppMocks[gtest_ar_2.success_].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                testing::A<std::__cxx11::string&>();
                testing::A<std::__cxx11::string_const&>();
                testing::A<unsigned_short>();
                CommissionerAppMock::gmock_Start
                          ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                            *)&gtest_ar_1,pCVar3,
                           (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            *)&gtest_ar,
                           (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            *)&local_8b8,(Matcher<unsigned_short> *)&local_868);
                testing::internal::GetWithoutMatchers();
                pTVar5 = testing::internal::
                         MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                         ::InternalExpectedAt
                                   ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                     *)&gtest_ar_1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                    ,0x12f,"*commissionerAppMocks[camIdx]","Start(_, _, _)");
                local_448._0_4_ = kNone;
                local_440._M_p = (pointer)&local_430;
                local_438 = (pointer)0x0;
                local_430._M_local_buf[0] = '\0';
                testing::Return<ot::commissioner::Error>((testing *)&gtest_ar_12,(Error *)local_448)
                ;
                testing::internal::ReturnAction::operator_cast_to_Action
                          ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                            *)&gtest_ar_,(ReturnAction *)&gtest_ar_12);
                pCVar3 = (CommissionerAppMock *)&gtest_ar_;
                testing::internal::
                TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                ::WillOnce(pTVar5,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                   *)&gtest_ar_);
                std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_12.message_);
                std::__cxx11::string::~string((string *)&local_440);
                std::
                _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                                *)&gtest_ar_1.message_);
                testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                          ((MatcherBase<unsigned_short> *)&local_868);
                testing::internal::
                MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                *)&local_8b8);
                testing::internal::
                MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                *)&gtest_ar);
                gtest_ar_1._0_8_ =
                     CommissionerAppMock::gmock_CancelRequests
                               ((MockSpec<void_()> *)
                                commissionerAppMocks[gtest_ar_2.success_].
                                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,pCVar3);
                testing::internal::GetWithoutMatchers();
                pTVar6 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                                   ((MockSpec<void_()> *)&gtest_ar_1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                    ,0x130,"*commissionerAppMocks[camIdx]","CancelRequests()");
                testing::internal::TypedExpectation<void_()>::Times(pTVar6,1);
              }
              _wasThreadRunning = _wasThreadRunning & 0xffffffffffffff00;
              shouldStop = false;
              testing::A<std::__cxx11::string&>();
              testing::A<std::__cxx11::string_const&>();
              testing::A<unsigned_short>();
              CommissionerAppMock::gmock_Start
                        ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&gtest_ar_1,this_00,
                         (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&local_8b8,
                         (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&local_868,(Matcher<unsigned_short> *)&gtest_ar_12);
              testing::internal::GetWithoutMatchers();
              pTVar5 = testing::internal::
                       MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                       ::InternalExpectedAt
                                 ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                   *)&gtest_ar_1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x134,"*commissionerAppMocks[2]","Start(_, _, _)");
              pTVar5 = testing::internal::
                       TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                       ::Times(pTVar5,1);
              gtest_ar_.success_ = false;
              gtest_ar_._1_7_ = 0;
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              pCVar3 = (CommissionerAppMock *)&gtest_ar;
              gtest_ar._0_8_ = &wasThreadRunning;
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )&shouldStop;
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar5,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                 *)pCVar3);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
              std::
              _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
              ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                              *)&gtest_ar_1.message_);
              testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                        ((MatcherBase<unsigned_short> *)&gtest_ar_12);
              testing::internal::
              MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)&local_868);
              testing::internal::
              MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)&local_8b8);
              gtest_ar._0_8_ =
                   CommissionerAppMock::gmock_CancelRequests
                             ((MockSpec<void_()> *)
                              commissionerAppMocks[2].
                              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,pCVar3);
              testing::internal::GetWithoutMatchers();
              pTVar6 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                                 ((MockSpec<void_()> *)&gtest_ar,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x13b,"*commissionerAppMocks[2]","CancelRequests()");
              pTVar6 = testing::internal::TypedExpectation<void_()>::Times(pTVar6,1);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_1.success_ = false;
              gtest_ar_1._1_7_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              local_760._0_8_ = 0;
              gtest_ar_._0_8_ = &shouldStop;
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_1);
              testing::internal::TypedExpectation<void_()>::WillOnce
                        (pTVar6,(Action<void_()> *)&gtest_ar_);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
              for (; ctx.mJobManager.mJobPool.
                     super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                     ._M_impl.super__Vector_impl_data._M_start !=
                     ctx.mJobManager.mJobPool.
                     super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                  ctx.mJobManager.mJobPool.
                  super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       ctx.mJobManager.mJobPool.
                       super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1) {
                ot::commissioner::Job::Run
                          (*ctx.mJobManager.mJobPool.
                            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
              }
              gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,shouldStop) ^ 1;
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (shouldStop != false) {
                testing::Message::Message((Message *)&gtest_ar);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                           (AssertionResult *)"shouldStop","true","false",expected_predicate_value);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_8b8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x141,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_8b8,(Message *)&gtest_ar);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8b8);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (gtest_ar._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              ot::commissioner::JobManager::CancelCommand(&ctx.mJobManager);
              gtest_ar_.success_ = wasThreadRunning;
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (wasThreadRunning == false) {
                testing::Message::Message((Message *)&gtest_ar);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                           (AssertionResult *)"wasThreadRunning","false","true",
                           expected_predicate_value);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_8b8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x144,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_8b8,(Message *)&gtest_ar);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8b8);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (gtest_ar._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              gtest_ar_.success_ = shouldStop;
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (shouldStop == false) {
                testing::Message::Message((Message *)&gtest_ar);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                           (AssertionResult *)"shouldStop","false","true",expected_predicate_value);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_8b8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x145,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_8b8,(Message *)&gtest_ar);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8b8);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (gtest_ar._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              lVar7 = 0x28;
              do {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&commissionerAppMocks[0].
                                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar7));
                lVar7 = lVar7 + -0x10;
              } while (lVar7 != -8);
              goto LAB_00124495;
            }
            testing::Message::Message((Message *)&gtest_ar_1);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_2.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar8 = *(char **)gtest_ar_2.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x11a,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
            this_01 = &gtest_ar_2.message_;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if (gtest_ar_1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
            }
          }
        }
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
LAB_00124495:
  JobManagerTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(JobManagerTestSuite, StartCancel)
{
    TestContext ctx;
    SetInitialExpectations(ctx);

    // Formally set default PSKc
    ctx.mConf.mPSKc = {'1', '0'};

    using namespace ot::commissioner::persistent_storage;
    // Prepare test data
    NetworkId      nid;
    BorderRouterId rid;

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan1", 1, 1, 0x1, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan2", 2, 2, 0x2, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20002, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan3", 3, 3, 0x3, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 2);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20003, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 2);

    Init(ctx, ".");

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[3] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(3)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"start"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    EXPECT_EQ(camIdx, 3);

    for (camIdx = 0; camIdx < 2; ++camIdx)
    {
        EXPECT_CALL(*commissionerAppMocks[camIdx], Start(_, _, _)).WillOnce(Return(Error{}));
        EXPECT_CALL(*commissionerAppMocks[camIdx], CancelRequests()).Times(1);
    }
    volatile bool wasThreadRunning = false;
    volatile bool shouldStop       = false;
    EXPECT_CALL(*commissionerAppMocks[2], Start(_, _, _)).Times(1).WillOnce(Invoke([&]() {
        wasThreadRunning = true;
        while (!shouldStop)
        {
        };
        return Error{};
    }));
    EXPECT_CALL(*commissionerAppMocks[2], CancelRequests()).Times(1).WillOnce(Invoke([&]() { shouldStop = true; }));

    for (auto job : ctx.mJobManager.mJobPool)
    {
        job->Run();
    }
    EXPECT_FALSE(shouldStop);

    ctx.mJobManager.CancelCommand();
    EXPECT_TRUE(wasThreadRunning);
    EXPECT_TRUE(shouldStop);
}